

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

pointer __thiscall
google::protobuf::RepeatedField<float>::AddNAlreadyReserved(RepeatedField<float> *this,int n)

{
  ulong uVar1;
  int v;
  int iVar2;
  char *pcVar3;
  Nonnull<const_char_*> failure_msg;
  LogMessage *this_00;
  string_view str;
  int local_3c;
  LogMessage local_38;
  
  uVar1 = (this->soo_rep_).field_0.long_rep.elements_int;
  v = internal::SooRep::size(&this->soo_rep_,(uVar1 & 4) == 0);
  local_3c = 2;
  if ((uVar1 & 4) != 0) {
    local_3c = (this->soo_rep_).field_0.long_rep.capacity;
  }
  if (n <= local_3c - v) {
    if ((uVar1 & 4) == 0) {
      pcVar3 = (char *)((long)&(this->soo_rep_).field_0 + 8);
    }
    else {
      pcVar3 = internal::LongSooRep::elements((LongSooRep *)this);
    }
    iVar2 = internal::SooRep::size(&this->soo_rep_,(uVar1 & 4) == 0);
    if ((iVar2 != v + n) &&
       ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) !=
        (undefined1  [16])0x0)) {
      internal::LongSooRep::elements((LongSooRep *)this);
    }
    set_size(this,(uVar1 & 4) == 0,v + n);
    return (pointer)(pcVar3 + (long)iVar2 * 4);
  }
  failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                          ((long)(local_3c - v),(long)n,"capacity - old_size >= n");
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_field.h"
             ,0x307,failure_msg);
  this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>(&local_38,&local_3c);
  str._M_str = ", ";
  str._M_len = 2;
  absl::lts_20250127::log_internal::LogMessage::
  CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(this_00,str);
  absl::lts_20250127::log_internal::LogMessage::operator<<(this_00,v);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_38);
}

Assistant:

inline Element* RepeatedField<Element>::AddNAlreadyReserved(int n)
    ABSL_ATTRIBUTE_LIFETIME_BOUND {
  const bool is_soo = this->is_soo();
  const int old_size = size(is_soo);
  [[maybe_unused]] const int capacity = Capacity(is_soo);
  ABSL_DCHECK_GE(capacity - old_size, n) << capacity << ", " << old_size;
  Element* p =
      unsafe_elements(is_soo) + ExchangeCurrentSize(is_soo, old_size + n);
  for (Element *begin = p, *end = p + n; begin != end; ++begin) {
    new (static_cast<void*>(begin)) Element;
  }
  return p;
}